

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

bool __thiscall duckdb::PersistentColumnData::HasUpdates(PersistentColumnData *this)

{
  PersistentColumnData *pPVar1;
  bool bVar2;
  PersistentColumnData *this_00;
  bool bVar3;
  
  bVar3 = true;
  if (this->has_updates == false) {
    this_00 = (this->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
              .
              super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (this->child_columns).
             super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             .
             super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = this_00 != pPVar1;
    if (bVar3) {
      bVar2 = HasUpdates(this_00);
      while (!bVar2) {
        this_00 = this_00 + 1;
        bVar3 = this_00 != pPVar1;
        if (this_00 == pPVar1) {
          return bVar3;
        }
        bVar2 = HasUpdates(this_00);
      }
    }
  }
  return bVar3;
}

Assistant:

bool PersistentColumnData::HasUpdates() const {
	if (has_updates) {
		return true;
	}
	for (auto &child_col : child_columns) {
		if (child_col.HasUpdates()) {
			return true;
		}
	}
	return false;
}